

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void prvTidyCopyConfig(TidyDocImpl *docTo,TidyDocImpl *docFrom)

{
  Bool BVar1;
  uint local_3c;
  Bool needReparseTagsDecls;
  uint changedUserTags;
  TidyOptionValue *to;
  TidyOptionValue *from;
  TidyOptionImpl *option;
  TidyDocImpl *pTStack_18;
  uint ixVal;
  TidyDocImpl *docFrom_local;
  TidyDocImpl *docTo_local;
  
  if (docTo != docFrom) {
    from = (TidyOptionValue *)option_defs;
    to = (docFrom->config).value;
    _needReparseTagsDecls = &docTo->config;
    pTStack_18 = docFrom;
    docFrom_local = docTo;
    BVar1 = NeedReparseTagDecls(docTo,_needReparseTagsDecls->value,to,&local_3c);
    prvTidyTakeConfigSnapshot(docFrom_local);
    for (option._4_4_ = 0; option._4_4_ < 0x68; option._4_4_ = option._4_4_ + 1) {
      if (option._4_4_ != *(uint *)from) {
        __assert_fail("ixVal == (uint) option->id",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                      ,0x2f8,"void prvTidyCopyConfig(TidyDocImpl *, TidyDocImpl *)");
      }
      CopyOptionValue(docFrom_local,(TidyOptionImpl *)from,
                      _needReparseTagsDecls->value + option._4_4_,to + option._4_4_);
      from = from + 7;
    }
    if (BVar1 != no) {
      ReparseTagDecls(docFrom_local,local_3c);
    }
    AdjustConfig(docFrom_local);
  }
  return;
}

Assistant:

void TY_(CopyConfig)( TidyDocImpl* docTo, TidyDocImpl* docFrom )
{
    if ( docTo != docFrom )
    {
        uint ixVal;
        const TidyOptionImpl* option = option_defs;
        const TidyOptionValue* from = &docFrom->config.value[ 0 ];
        TidyOptionValue* to   = &docTo->config.value[ 0 ];
        uint changedUserTags;
        Bool needReparseTagsDecls = NeedReparseTagDecls( docTo, to, from,
                                                         &changedUserTags );

        TY_(TakeConfigSnapshot)( docTo );
        for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
        {
            assert( ixVal == (uint) option->id );
            CopyOptionValue( docTo, option, &to[ixVal], &from[ixVal] );
        }
        if ( needReparseTagsDecls )
            ReparseTagDecls( docTo, changedUserTags  );
        AdjustConfig( docTo );  /* Make sure it's consistent */
    }
}